

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XIncludeUtils.cpp
# Opt level: O1

XMLCh * xercesc_4_0::getBaseAttrValue(DOMNode *node)

{
  short *psVar1;
  short *psVar2;
  int iVar3;
  long *plVar4;
  ulong uVar5;
  long *plVar6;
  undefined2 *puVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  XMLCh *local_40;
  undefined4 extraout_var;
  
  iVar3 = (*node->_vptr_DOMNode[4])();
  if (iVar3 == 1) {
    iVar3 = (*node->_vptr_DOMNode[0x1a])(node);
    if ((char)iVar3 == '\0') {
      bVar10 = true;
    }
    else {
      iVar3 = (*node->_vptr_DOMNode[0xb])(node);
      plVar4 = (long *)CONCAT44(extraout_var,iVar3);
      uVar5 = (**(code **)(*plVar4 + 0x28))(plVar4);
      bVar10 = uVar5 == 0;
      if (!bVar10) {
        uVar9 = 0;
        do {
          plVar6 = (long *)(**(code **)(*plVar4 + 0x18))(plVar4,uVar9);
          puVar7 = (undefined2 *)(**(code **)(*plVar6 + 0x140))(plVar6);
          if (puVar7 == &XIncludeUtils::fgXIBaseAttrName) {
            bVar11 = true;
          }
          else {
            if (puVar7 != (undefined2 *)0x0) {
              lVar8 = 0;
              do {
                psVar1 = (short *)((long)puVar7 + lVar8);
                if (*psVar1 == 0) {
                  bVar11 = *(short *)((long)&XIncludeUtils::fgXIBaseAttrName + lVar8) == 0;
                  goto LAB_00346c2e;
                }
                psVar2 = (short *)((long)&XIncludeUtils::fgXIBaseAttrName + lVar8);
                lVar8 = lVar8 + 2;
              } while (*psVar1 == *psVar2);
            }
            bVar11 = false;
          }
LAB_00346c2e:
          if (bVar11) {
            local_40 = (XMLCh *)(**(code **)(*plVar6 + 0x150))(plVar6);
            break;
          }
          uVar9 = uVar9 + 1;
          bVar10 = uVar5 <= uVar9;
        } while (uVar9 != uVar5);
      }
    }
    if (!bVar10) {
      return local_40;
    }
  }
  return (XMLCh *)0x0;
}

Assistant:

static const XMLCh *
getBaseAttrValue(DOMNode *node){
    if (node->getNodeType() == DOMNode::ELEMENT_NODE){
        DOMElement *elem = (DOMElement *)node;
        if(elem->hasAttributes()) {
            /* get all the attributes of the node */
            DOMNamedNodeMap *pAttributes = elem->getAttributes();
            XMLSize_t nSize = pAttributes->getLength();
            for(XMLSize_t i=0;i<nSize;++i) {
                DOMAttr *pAttributeNode = (DOMAttr*) pAttributes->item(i);
                /* get attribute name */
                if (XMLString::equals(pAttributeNode->getName(), XIncludeUtils::fgXIBaseAttrName)){
                    /*if (namespace == XMLUni::fgXMLString){

                    }*/
                    return pAttributeNode->getValue();
                }
            }
        }
    }
    return NULL;
}